

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O1

void EverCrypt_HKDF_expand
               (Spec_Hash_Definitions_hash_alg a,uint8_t *okm,uint8_t *prk,uint32_t prklen,
               uint8_t *info,uint32_t infolen,uint32_t len)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  uint8_t *data;
  uint8_t *data_00;
  uint32_t extraout_EDX;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  undefined7 in_register_00000039;
  ulong uVar9;
  void *pvVar10;
  uint32_t data_len;
  uint32_t uVar11;
  ulong __n;
  uint8_t *dst;
  uint8_t uVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  undefined8 uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  uint32_t uStack_54;
  uint8_t *puStack_50;
  void *pvStack_48;
  uint uStack_40;
  uint32_t uStack_3c;
  
  pvVar10 = (void *)CONCAT44(in_register_0000000c,prklen);
  uVar8 = (int)CONCAT71(in_register_00000039,a) - 1;
  uVar6 = (ulong)uVar8;
  uVar9 = uVar6;
  if (uVar8 < 7) {
    uVar9 = (long)&switchD_0017b87e::switchdataD_001e5558 +
            (long)(int)(&switchD_0017b87e::switchdataD_001e5558)[uVar6];
    switch(uVar6) {
    case 0:
      expand_sha2_256(okm,prk,prklen,info,infolen,len);
      return;
    case 1:
      expand_sha2_384(okm,prk,prklen,info,infolen,len);
      return;
    case 2:
      expand_sha2_512(okm,prk,prklen,info,infolen,len);
      return;
    case 3:
      expand_sha1(okm,prk,prklen,info,infolen,len);
      return;
    case 5:
      expand_blake2s(okm,prk,prklen,info,infolen,len);
      return;
    case 6:
      expand_blake2b(okm,prk,prklen,info,infolen,len);
      return;
    }
  }
  EverCrypt_HKDF_expand_cold_1();
  __n = (ulong)info & 0xffffffff;
  uStack_80 = (ulong)infolen / 0x14;
  uStack_68 = (ulong)((infolen / 0x14) * 4);
  uVar6 = (ulong)((int)info + 0x15);
  uVar14 = uVar6 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar14;
  dst = (uint8_t *)((long)&uStack_80 + lVar1);
  uStack_78 = uVar9;
  uStack_70 = uVar6;
  puStack_50 = okm;
  pvStack_48 = pvVar10;
  uStack_40 = infolen;
  uStack_3c = extraout_EDX;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17b979;
  memset(dst,0,uVar6);
  pvVar10 = pvStack_48;
  data_00 = (uint8_t *)((long)&uStack_70 + (4 - uVar14));
  uStack_60 = __n;
  pvStack_48 = (void *)__n;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17b99b;
  memcpy(data_00,pvVar10,__n);
  if (0x13 < uStack_40) {
    uStack_54 = (int)uStack_60 + 1;
    lVar2 = uStack_68 * 5;
    uVar12 = '\x01';
    lVar7 = 0;
    do {
      data_00[(long)pvStack_48] = uVar12;
      uVar11 = uStack_3c;
      puVar4 = puStack_50;
      data = data_00;
      data_len = uStack_54;
      if (lVar7 != 0) {
        data = dst;
        data_len = (uint32_t)uStack_70;
      }
      *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17b9ea;
      EverCrypt_HMAC_compute_sha1(dst,puVar4,uVar11,data,data_len);
      *(undefined4 *)(uStack_78 + 0x10 + lVar7) = *(undefined4 *)((long)&uStack_70 + lVar1);
      uVar3 = *(undefined8 *)((long)&uStack_78 + lVar1);
      *(undefined8 *)(uStack_78 + lVar7) = *(undefined8 *)dst;
      ((undefined8 *)(uStack_78 + lVar7))[1] = uVar3;
      lVar7 = lVar7 + 0x14;
      uVar12 = uVar12 + '\x01';
    } while (lVar2 != lVar7);
  }
  uVar5 = uStack_40;
  uVar8 = (int)uStack_68 * 5;
  if (uVar8 < uStack_40) {
    uVar13 = uStack_40 + (int)uStack_68 * -5;
    data_00[(long)pvStack_48] = (char)uStack_80 + '\x01';
    puVar4 = puStack_50;
    if (uVar5 < 0x14) {
      uVar11 = (int)uStack_60 + 1;
    }
    else {
      uVar11 = (uint32_t)uStack_70;
      data_00 = dst;
    }
    *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17ba61;
    EverCrypt_HMAC_compute_sha1(dst,puVar4,uStack_3c,data_00,uVar11);
    pvVar10 = (void *)(uStack_78 + uVar8);
    *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17ba75;
    memcpy(pvVar10,dst,(ulong)uVar13);
  }
  return;
}

Assistant:

void
EverCrypt_HKDF_expand(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        expand_sha1(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        expand_sha2_256(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        expand_sha2_384(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        expand_sha2_512(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        expand_blake2s(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        expand_blake2b(okm, prk, prklen, info, infolen, len);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}